

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

bool cppwinrt::has_fastabi(TypeDef *type)

{
  CustomAttribute CVar1;
  string_view local_20;
  string_view local_10;
  
  if (settings[0x1d0] == '\x01') {
    local_10._M_len = 0x1b;
    local_10._M_str = "Windows.Foundation.Metadata";
    local_20._M_len = 0x10;
    local_20._M_str = "FastAbiAttribute";
    CVar1 = winmd::reader::get_attribute<winmd::reader::TypeDef>(type,&local_10,&local_20);
    return CVar1.super_row_base<winmd::reader::CustomAttribute>.m_table != (table_base *)0x0;
  }
  return false;
}

Assistant:

static bool has_fastabi(TypeDef const& type)
    {
        return settings.fastabi&& has_attribute(type, "Windows.Foundation.Metadata", "FastAbiAttribute");
    }